

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ArrayJoinPromiseNode<unsigned_int>::destroy(ArrayJoinPromiseNode<unsigned_int> *this)

{
  ArrayJoinPromiseNode<unsigned_int> *this_local;
  
  freePromise<kj::_::ArrayJoinPromiseNode<unsigned_int>>(this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }